

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
IDisk::GetCAT_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,IDisk *this,AutorunType *autorun_type,int user)

{
  ILog *pIVar1;
  uchar uVar2;
  bool bVar3;
  iterator it;
  pointer paVar4;
  reference pvVar5;
  long lVar6;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  uint uVar7;
  ulong uVar8;
  char *__s;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint track;
  ulong uVar12;
  ulong uVar13;
  int cpt;
  uint uVar14;
  allocator<char> local_d1;
  IDisk *local_d0;
  int local_c4;
  void *local_c0;
  Track track_info;
  string str;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *autorun_type = AUTO_UNKNOWN;
  track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = this;
  GetTrackInfo(this,0,0,&track_info);
  if (track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_start) goto LAB_0017424d;
  track = 0;
  for (paVar4 = track_info.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar4 != track_info.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_finish; paVar4 = paVar4 + 1) {
    if (paVar4->r == 'A') {
      track = 2;
    }
  }
  pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                     (&track_info.list_sector_,0);
  if ((pvVar5->r & 0xc0) == 0x40) {
    *autorun_type = AUTO_FILE;
    lVar11 = 0x41;
LAB_00173fa2:
    if (track == 0) goto LAB_00173fc6;
LAB_00174001:
    if (track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           track_info.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    GetTrackInfo(local_d0,0,track,&track_info);
  }
  else {
    pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                       (&track_info.list_sector_,0);
    if (pvVar5->r < 0xc0) {
      pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                         (&track_info.list_sector_,0);
      if (0x3f < pvVar5->r) {
        lVar11 = 0;
        std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at(&track_info.list_sector_,0);
        goto LAB_00173fa2;
      }
      *autorun_type = AUTO_CPM;
      track = 1;
      lVar11 = 1;
      goto LAB_00174001;
    }
    *autorun_type = AUTO_FILE;
    lVar11 = 0xc1;
LAB_00173fc6:
    track = 0;
  }
  local_c0 = operator_new__(0x800);
  uVar13 = 0;
  memset(local_c0,0,0x800);
  uVar7 = 0;
  local_c4 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    lVar6 = ((long)track_info.list_sector_.
                   super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)track_info.list_sector_.
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_start) % 0x24;
    if ((((ulong)(((long)track_info.list_sector_.
                         super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)track_info.list_sector_.
                        super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x24) <= uVar8) || (3 < local_c4)) ||
       (0x7ff < (int)uVar13)) break;
    pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                       (&track_info.list_sector_,uVar8);
    if (((uint)lVar11 <= (uint)pvVar5->r) &&
       (pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                           (&track_info.list_sector_,uVar8), (uint)pvVar5->r < (uint)lVar11 + 4)) {
      pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                         (&track_info.list_sector_,uVar8);
      uVar9 = pvVar5->dam_offset;
      pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                         (&track_info.list_sector_,uVar8);
      uVar9 = uVar9 + 0x40;
      local_c4 = local_c4 + 1;
      uVar14 = 0;
      for (uVar13 = ((ulong)pvVar5->r - lVar11) * 0x200;
          (pvVar5 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::at
                              (&track_info.list_sector_,uVar8), uVar14 < pvVar5->real_size &&
          ((long)uVar13 < 0x800)); uVar13 = uVar13 + 1) {
        uVar2 = GetNextByte(local_d0,0,track,uVar9);
        *(uchar *)((long)local_c0 + uVar13) = uVar2;
        uVar9 = uVar9 + 0x10;
        uVar14 = uVar14 + 1;
      }
    }
    uVar7 = uVar7 + 1;
  }
  uVar12 = 0;
  uVar8 = uVar13 & 0xffffffff;
  if ((int)uVar13 < 1) {
    uVar8 = uVar12;
  }
  iVar10 = 0;
  for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
    pIVar1 = local_d0->log_;
    if (pIVar1 != (ILog *)0x0) {
      (**(code **)(*(long *)pIVar1 + 8))(pIVar1,*(undefined1 *)((long)local_c0 + uVar12),lVar6);
      pIVar1 = local_d0->log_;
      lVar6 = extraout_RDX;
      if (pIVar1 != (ILog *)0x0) {
        (*(code *)**(undefined8 **)pIVar1)(pIVar1," ");
        lVar6 = extraout_RDX_00;
      }
    }
    iVar10 = iVar10 + 1;
    if (iVar10 == 0x10) {
      iVar10 = 0;
      if (local_d0->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)local_d0->log_ + 0x20))();
        lVar6 = extraout_RDX_01;
      }
    }
  }
  __s = (char *)((long)local_c0 + 1);
  for (uVar13 = 1; uVar13 < 0x800; uVar13 = uVar13 + 0x20) {
    if ((user == -1) || ((uint)(byte)__s[-1] == user)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&str,__s,&local_d1);
      std::__cxx11::string::string((string *)&local_50,(string *)&str);
      bVar3 = ValidName(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&str);
      }
      std::__cxx11::string::~string((string *)&str);
    }
    __s = __s + 0x20;
  }
  operator_delete__(local_c0);
LAB_0017424d:
  std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
            ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)&track_info);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>  IDisk::GetCAT(IDisk::AutorunType& autorun_type, int user)
{
   std::vector<std::string> filename_vector;
   autorun_type = IDisk::AUTO_UNKNOWN;

   // Get info
   IDisk::Track track_info;
   GetTrackInfo(0, 0, &track_info);

   if (track_info.list_sector_.size() == 0)
   {
      return filename_vector;
   }

   // CPM ?
   int index_cat = 0;
   unsigned char first_sector = 00;
   // A |CPM can be run if a"0x41" sector is found
   for (auto it = track_info.list_sector_.begin(); it != track_info.list_sector_.end(); ++it)
   {
      if (it->r == 0x41)
      {
         index_cat = 2;
      }
   }

   // SYSTEM / VENDOR
   if ((track_info.list_sector_.at(0).r & 0xC0) == 0x40)
   {
      first_sector = 0x41;
      autorun_type = IDisk::AUTO_FILE;
   }
   // DATA
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0xC0)
   {
      index_cat = 0;
      first_sector = 0xC1;
      autorun_type = IDisk::AUTO_FILE;
   }
   // IBM
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0x00
      || (track_info.list_sector_.at(0).r & 0xC0) == 0x80)
   {
      index_cat = 1;
      first_sector = 0x01;
      autorun_type = IDisk::AUTO_CPM;
   }

   if (index_cat != 0)
   {
      track_info.list_sector_.clear();
      GetTrackInfo(0, index_cat, &track_info);
   }

#define NB_SECTOR_FOR_CAT 4

   int total_size = NB_SECTOR_FOR_CAT * 512;
   /*for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   {
      totalSize += trackInfo.listSector.at(i).RealSize;
   }*/

   // No, try to fins appropriate file to run
   unsigned char* track_data = new unsigned char[total_size];
   memset(track_data, 0, total_size);
   int offset_data = 0;


   // It's in first track, NB_SECTOR_FOR_CAT firsts sectors, from first_sector to first_sector + NB_SECTOR_FOR_CAT
   // todo : read the proper sectors !
   int nb_sector_read = 0;

   //for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   unsigned int index_sector = 0;
   int nb_read_sector = 0;
   while (index_sector < track_info.list_sector_.size() && nb_read_sector < NB_SECTOR_FOR_CAT && offset_data < total_size)
   {
      // Read first xx sectors
      if (track_info.list_sector_.at(index_sector).r >= first_sector)
      {
         if (track_info.list_sector_.at(index_sector).r - first_sector < NB_SECTOR_FOR_CAT)
         {
            int index = track_info.list_sector_.at(index_sector).dam_offset + 64;

            offset_data = (track_info.list_sector_.at(index_sector).r - first_sector) * 512;
            nb_read_sector++;
            for (int cpt = 0; cpt < track_info.list_sector_.at(index_sector).real_size && offset_data < total_size; cpt++)
            {
               // Walk all of them - remove the 0x80 bits
               unsigned char b = GetNextByte(0, index_cat, index);
               track_data[offset_data++] = b;
               index += 16;
            }
         }
      }
      index_sector++;
   }

   // Dump TrackData
   int line_count = 0;
   for (int hex = 0; hex < offset_data; hex++)
   {
      LOGB(track_data[hex]);
      LOG(" ");
      if (++line_count == 16)
      {
         LOGEOL
            line_count = 0;
      }
   }

   int offset = 1;
   bool end = false;

   while (offset < total_size && !end)
   {
      if (user == -1 || track_data[offset - 1] == user)
      {
         // Add to the name vector
         std::string str = (const char*)(&track_data[offset]);
         if (ValidName(str))
         {
            filename_vector.push_back(str);
         }
      }
      offset += 32;
   }
   delete[]track_data;

   return filename_vector;
}